

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort2.cpp
# Opt level: O2

uchar ** traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,1024u>,unsigned_char>
                   (TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *node,uchar **dst
                   ,size_t depth,_func_void_uchar_ptr_ptr_int_int *small_sort)

{
  vector_block<unsigned_char_*,_1024U> *this;
  bool bVar1;
  TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_> *node_00;
  pointer pppuVar2;
  size_t __n;
  uchar **__dest;
  size_t i;
  ulong uVar3;
  uint index;
  long lVar4;
  
  index = 0;
  do {
    if ((ulong)((long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= (ulong)index) {
      std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
                ((_Vector_base<void_*,_std::allocator<void_*>_> *)node);
      operator_delete(node);
      return dst;
    }
    bVar1 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::is_trie(node,index);
    if (bVar1) {
      node_00 = TrieNode<unsigned_char,_vector_block<unsigned_char_*,_1024U>_>::get_node(node,index)
      ;
      dst = traverse<void(*)(unsigned_char**,int,int),vector_block<unsigned_char*,1024u>,unsigned_char>
                      (node_00,dst,depth + 1,small_sort);
    }
    else {
      this = (vector_block<unsigned_char_*,_1024U> *)
             (node->_buckets).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
             super__Vector_impl_data._M_start[index];
      if (this != (vector_block<unsigned_char_*,_1024U> *)0x0) {
        pppuVar2 = (this->_index_block).
                   super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                   super__Vector_impl_data._M_start;
        small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                     (this->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_finish;
        if ((long)small_sort - (long)pppuVar2 == 0) {
          __assert_fail("not v._index_block.empty()",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_block.h"
                        ,0x5b,
                        "void copy(const vector_block<T, B> &, OutputIterator) [T = unsigned char *, B = 1024U, OutputIterator = unsigned char **]"
                       );
        }
        lVar4 = ((long)small_sort - (long)pppuVar2) * 0x80 - (ulong)this->_left_in_block;
        __dest = dst;
        for (uVar3 = 1; uVar3 < (ulong)((long)small_sort - (long)pppuVar2 >> 3); uVar3 = uVar3 + 1)
        {
          memmove(__dest,pppuVar2[uVar3 - 1],0x2000);
          __dest = __dest + 0x400;
          pppuVar2 = (this->_index_block).
                     super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl
                     .super__Vector_impl_data._M_start;
          small_sort = (_func_void_uchar_ptr_ptr_int_int *)
                       (this->_index_block).
                       super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                       _M_impl.super__Vector_impl_data._M_finish;
        }
        __n = (long)this->_insertpos - (long)*(pointer)((long)small_sort + -8);
        if (__n != 0) {
          memmove(__dest,*(pointer)((long)small_sort + -8),__n);
        }
        if ((char)index != '\0') {
          mkqsort(dst,(int)lVar4,(int)depth);
        }
        dst = dst + lVar4;
        vector_block<unsigned_char_*,_1024U>::~vector_block(this);
        operator_delete(this);
      }
    }
    index = index + 1;
  } while( true );
}

Assistant:

static unsigned char**
traverse(TrieNode<CharT, BucketT>* node,
         unsigned char** dst,
         size_t depth,
         SmallSort small_sort)
{
	for (unsigned i=0; i < node->_buckets.size(); ++i) {
		if (node->is_trie(i)) {
			dst = traverse(node->get_node(i),
				dst, depth+sizeof(CharT), small_sort);
		} else {
			BucketT* bucket =
				static_cast<BucketT*>(node->_buckets[i]);
			if (not bucket) continue;
			size_t bsize = bucket->size();
			copy(*bucket, dst);
			if (not is_end(i)) small_sort(dst, bsize, depth);
			dst += bsize;
			delete bucket;
		}
	}
	delete node;
	return dst;
}